

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

shared_ptr<Handler> __thiscall
GameEngine::generateBotHandlersChain(GameEngine *this,shared_ptr<Player> *bot)

{
  Player *this_00;
  CellType *pCVar1;
  Handler *this_01;
  int iVar2;
  undefined8 this_02;
  undefined8 this_03;
  undefined8 uVar3;
  GameEngine *pGVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  TypeName TVar8;
  ParamType size;
  int32_t iVar9;
  size_t sVar10;
  undefined4 extraout_var;
  RandomGenerator *pRVar11;
  Config *this_04;
  pair<int,_int> pVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar14;
  Handler *__tmp;
  undefined8 *in_RDX;
  _func_int **pp_Var15;
  ulong uVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_05;
  long lVar18;
  uint uVar19;
  size_t index;
  bool bVar20;
  shared_ptr<Handler> sVar21;
  shared_ptr<Handler> link;
  shared_ptr<Population> newPopulation;
  vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> chain;
  undefined1 local_1b8 [40];
  undefined1 local_190 [16];
  int local_180;
  long local_178;
  _func_int **local_170;
  _func_int **local_168;
  _func_int **local_160;
  _func_int **local_158;
  undefined8 *local_150;
  shared_ptr<Handler> local_148;
  shared_ptr<Population> local_138;
  shared_ptr<Population> local_128;
  shared_ptr<Population> local_118;
  shared_ptr<Population> local_108;
  shared_ptr<Population> local_f8;
  shared_ptr<Population> local_e8;
  shared_ptr<Population> local_d8;
  shared_ptr<Population> local_c8;
  shared_ptr<Population> local_b8;
  vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> local_a8;
  shared_ptr<Population> local_88;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  GameEngine *local_48;
  ulong local_40;
  ulong local_38;
  
  local_a8.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._24_8_ = bot;
  local_150 = in_RDX;
  local_48 = this;
  sVar10 = Player::getPopulationsNumber((Player *)*in_RDX);
  if (0 < (int)(uint)sVar10) {
    local_40 = (ulong)((uint)sVar10 & 0x7fffffff);
    local_178 = 0;
    local_50 = (_func_int **)&PTR___Sp_counted_ptr_inplace_001396c8;
    local_58 = (_func_int **)&PTR_setXYPos_00139b38;
    local_60 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139748;
    local_68 = (_func_int **)&PTR_setXYPos_00139ba8;
    local_70 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139798;
    local_78 = (_func_int **)&PTR_setXYPos_00139be0;
    local_168 = (_func_int **)&PTR___Sp_counted_ptr_inplace_001397e8;
    local_170 = (_func_int **)&PTR_setXYPos_00139b70;
    local_158 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139838;
    local_160 = (_func_int **)&PTR_setXYPos_00139c18;
    uVar16 = 0;
    do {
      local_38 = uVar16;
      Player::getPopulation((Player *)local_1b8,(int32_t)*local_150);
      this_03 = local_1b8._8_8_;
      this_02 = local_1b8._0_8_;
      local_1b8._0_8_ = (Population *)0x0;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_180 = Population::GetXPos((Population *)this_02);
      register0x00000004 = extraout_var;
      iVar5 = Population::GetYPos((Population *)this_02);
      pRVar11 = RandomGenerator::getInstance();
      iVar6 = RandomGenerator::randInt(pRVar11,1,2);
      iVar7 = Population::GetAnimalAmount((Population *)this_02);
      this_04 = Config::getInstance();
      TVar8 = Population::GetType((Population *)this_02);
      size = Population::GetSize((Population *)this_02);
      iVar9 = Config::getMaxAmount(this_04,TVar8,size);
      iVar2 = iVar7 * 10;
      if (iVar2 != iVar9 * 9 && SBORROW4(iVar2,iVar9 * 9) == iVar2 + iVar9 * -9 < 0) {
        iVar6 = 3;
      }
      if (iVar6 == 1) {
        pRVar11 = RandomGenerator::getInstance();
        iVar5 = RandomGenerator::randInt(pRVar11,0,3);
        switch(iVar5) {
        case 0:
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var13->_M_use_count = 1;
          p_Var13->_M_weak_count = 1;
          p_Var13->_vptr__Sp_counted_base = local_50;
          local_1b8._0_8_ = p_Var13 + 1;
          p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[1]._M_use_count = 0;
          p_Var13[1]._M_weak_count = 0;
          p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[2]._M_use_count = 0;
          p_Var13[2]._M_weak_count = 0;
          p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_58;
          break;
        case 1:
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var13->_M_use_count = 1;
          p_Var13->_M_weak_count = 1;
          p_Var13->_vptr__Sp_counted_base = local_60;
          local_1b8._0_8_ = p_Var13 + 1;
          p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[1]._M_use_count = 0;
          p_Var13[1]._M_weak_count = 0;
          p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[2]._M_use_count = 0;
          p_Var13[2]._M_weak_count = 0;
          p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_68;
          break;
        case 2:
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var13->_M_use_count = 1;
          p_Var13->_M_weak_count = 1;
          p_Var13->_vptr__Sp_counted_base = local_70;
          local_1b8._0_8_ = p_Var13 + 1;
          p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[1]._M_use_count = 0;
          p_Var13[1]._M_weak_count = 0;
          p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[2]._M_use_count = 0;
          p_Var13[2]._M_weak_count = 0;
          p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_78;
          break;
        case 3:
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          p_Var13->_M_use_count = 1;
          p_Var13->_M_weak_count = 1;
          p_Var13->_vptr__Sp_counted_base = local_168;
          local_1b8._0_8_ = p_Var13 + 1;
          p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[1]._M_use_count = 0;
          p_Var13[1]._M_weak_count = 0;
          p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[2]._M_use_count = 0;
          p_Var13[2]._M_weak_count = 0;
          p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          pp_Var15 = local_170;
          break;
        default:
          goto switchD_00128208_default;
        }
        uVar3 = local_1b8._8_8_;
        p_Var13[1]._vptr__Sp_counted_base = pp_Var15;
        bVar20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1b8._8_8_ = p_Var13;
        if (bVar20) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
        }
switchD_00128208_default:
        local_b8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_02;
        local_b8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
          }
        }
        Handler::setPopulation((Handler *)local_1b8._0_8_,&local_b8);
        this_05._M_pi =
             local_b8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_001288c1:
        if (this_05._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_05._M_pi);
        }
      }
      else {
        if (iVar6 != 2) {
          if (iVar6 != 3) goto LAB_001288cb;
          local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)this_02;
          local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
            }
          }
          pVar12 = getDestinationPos((GameEngine *)local_1b8._24_8_,&local_f8);
          if (local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((ulong)pVar12 >> 0x20 == 0 && pVar12.first == 0) {
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
            uVar3 = local_1b8._8_8_;
            p_Var13->_M_use_count = 1;
            p_Var13->_M_weak_count = 1;
            p_Var13->_vptr__Sp_counted_base = local_168;
            local_1b8._0_8_ = p_Var13 + 1;
            p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var13[1]._M_use_count = 0;
            p_Var13[1]._M_weak_count = 0;
            p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var13[2]._M_use_count = 0;
            p_Var13[2]._M_weak_count = 0;
            p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var13[1]._vptr__Sp_counted_base = local_170;
            bVar20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b8._8_8_ = p_Var13;
            if (bVar20) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
            }
            local_108.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)this_02;
            local_108.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
              }
            }
            Handler::setPopulation((Handler *)local_1b8._0_8_,&local_108);
            this_05._M_pi =
                 local_108.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
          }
          else {
            local_190._0_8_ = (Population *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<Population,std::allocator<Population>,Population&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_190 + 8),
                       (Population **)local_190,(allocator<Population> *)(local_1b8 + 0x27),
                       (Population *)this_02);
            uVar3 = local_190._0_8_;
            iVar6 = Population::GetAnimalAmount((Population *)local_190._0_8_);
            Population::SetAnimalAmount((Population *)uVar3,iVar6 / 2);
            iVar6 = Population::GetAnimalAmount((Population *)this_02);
            Population::SetAnimalAmount((Population *)this_02,iVar6 / 2);
            p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
            uVar3 = local_1b8._8_8_;
            p_Var13->_M_use_count = 1;
            p_Var13->_M_weak_count = 1;
            p_Var13->_vptr__Sp_counted_base = local_158;
            local_1b8._0_8_ = p_Var13 + 1;
            p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var13[1]._M_use_count = 0;
            p_Var13[1]._M_weak_count = 0;
            p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var13[3]._M_use_count = 0;
            p_Var13[3]._M_weak_count = 0;
            p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            p_Var13[2]._M_use_count = 0;
            p_Var13[2]._M_weak_count = 0;
            p_Var13[1]._vptr__Sp_counted_base = local_160;
            p_Var13[3]._M_use_count = -1;
            p_Var13[3]._M_weak_count = -1;
            bVar20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b8._8_8_ = p_Var13;
            if (bVar20) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
            }
            uVar17 = (int)_local_180 + pVar12.first;
            uVar19 = iVar5 + pVar12.second;
            (**(((CompoundMutation *)local_1b8._0_8_)->super_MutationComponent).
               _vptr_MutationComponent)(local_1b8._0_8_,(ulong)uVar17,(ulong)uVar19);
            local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_190._0_8_;
            local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
              }
            }
            Handler::setPopulation((Handler *)local_1b8._0_8_,&local_118);
            if (local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_118.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            this_00 = (Player *)*local_150;
            local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_190._0_8_;
            local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
              }
            }
            Player::addNewPopulation(this_00,&local_128);
            if (local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_128.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            sVar10 = (size_t)(int)uVar19;
            pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,sVar10);
            pCVar1 = (pvVar14->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_190._0_8_;
            local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
              }
            }
            CellType::setCurrentPopulation(pCVar1,&local_138);
            if (local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_138.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            TVar8 = Population::GetType((Population *)this_02);
            if (TVar8 == HERBIVORE) {
              pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,sVar10);
              CellType::setHerbivoreCount
                        ((pvVar14->
                         super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                         super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
              this_05._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
            }
            else {
              pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,sVar10);
              CellType::setCarnivoreCount
                        ((pvVar14->
                         super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                         super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
              this_05._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
            }
          }
          goto LAB_001288c1;
        }
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
        uVar3 = local_1b8._8_8_;
        p_Var13->_M_use_count = 1;
        p_Var13->_M_weak_count = 1;
        p_Var13->_vptr__Sp_counted_base = local_158;
        local_1b8._0_8_ = p_Var13 + 1;
        p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var13[1]._M_use_count = 0;
        p_Var13[1]._M_weak_count = 0;
        p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var13[3]._M_use_count = 0;
        p_Var13[3]._M_weak_count = 0;
        p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var13[2]._M_use_count = 0;
        p_Var13[2]._M_weak_count = 0;
        p_Var13[1]._vptr__Sp_counted_base = local_160;
        p_Var13[3]._M_use_count = -1;
        p_Var13[3]._M_weak_count = -1;
        bVar20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1b8._8_8_ = p_Var13;
        if (bVar20) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
        }
        local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_02;
        local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
          }
        }
        pVar12 = getDestinationPos((GameEngine *)local_1b8._24_8_,&local_c8);
        if (local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        uVar17 = pVar12.first + (int)_local_180;
        uVar19 = pVar12.second + iVar5;
        (**(((CompoundMutation *)local_1b8._0_8_)->super_MutationComponent)._vptr_MutationComponent)
                  (local_1b8._0_8_,(ulong)uVar17,(ulong)uVar19);
        local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_02;
        local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
          }
        }
        Handler::setPopulation((Handler *)local_1b8._0_8_,&local_d8);
        if (local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        sVar10 = (size_t)iVar5;
        pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,sVar10);
        lVar18 = (long)local_180;
        local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        CellType::setCurrentPopulation
                  ((pvVar14->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar18].
                   super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_88);
        if (local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        index = (size_t)(int)uVar19;
        pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,index);
        pCVar1 = (pvVar14->
                 super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                 super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_02;
        local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(this_03 + 8) = *(_Atomic_word *)(this_03 + 8) + 1;
          }
        }
        CellType::setCurrentPopulation(pCVar1,&local_e8);
        if (local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        TVar8 = Population::GetType((Population *)this_02);
        if (TVar8 == HERBIVORE) {
          pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,sVar10);
          CellType::setHerbivoreCount
                    ((pvVar14->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar18].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
          pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,index);
          CellType::setHerbivoreCount
                    ((pvVar14->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
        }
        else {
          pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,sVar10);
          CellType::setCarnivoreCount
                    ((pvVar14->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar18].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
          pvVar14 = Map::operator[](*(Map **)local_1b8._24_8_,index);
          CellType::setCarnivoreCount
                    ((pvVar14->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
        }
      }
LAB_001288cb:
      std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::push_back
                (&local_a8,(value_type *)local_1b8);
      if (local_178 != 0) {
        this_01 = *(Handler **)
                   ((long)&local_a8.
                           super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   local_178);
        local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)&((local_a8.
                        super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + local_178);
        local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&((local_a8.
                        super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi +
              local_178);
        if (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Handler::setNext(this_01,&local_148);
        if (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
      }
      uVar16 = local_38 + 1;
      local_178 = local_178 + 0x10;
    } while (local_40 != uVar16);
  }
  pGVar4 = local_48;
  (local_48->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((local_a8.
         super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var13 = ((local_a8.
              super__Vector_base<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (local_48->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var13;
  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
    }
  }
  std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::~vector
            (&local_a8);
  sVar21.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar21.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pGVar4;
  return (shared_ptr<Handler>)sVar21.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Handler> GameEngine::generateBotHandlersChain(std::shared_ptr<Player> bot) {
  std::vector<std::shared_ptr<Handler> > chain;
  int32_t populationAmount = bot->getPopulationsNumber();
  for (int32_t i = 0; i < populationAmount; ++i) {
    std::shared_ptr<Population> tempPopulation = std::move(bot->getPopulation(i));
    std::shared_ptr<Handler> link;
    int32_t x = tempPopulation->GetXPos();
    int32_t y = tempPopulation->GetYPos();
    int32_t dX, dY;
    std::pair<int32_t, int32_t> pos;
    int32_t mutationType;
    int32_t handlerType = RandomGenerator::getInstance().randInt(1, 2);
    if (tempPopulation->GetAnimalAmount() * 10
        > Config::getInstance().getMaxAmount(tempPopulation->GetType(), tempPopulation->GetSize()) * 9) {
    handlerType = 3;
    }
    switch (handlerType) {
      case 1:mutationType = RandomGenerator::getInstance().randInt(0, 3);
        switch (mutationType) {
          case 0:link = std::make_shared<CoverMutationHandler>();
            break;
          case 1:link = std::make_shared<SafetyMutationHandler>();
            break;
          case 2:link = std::make_shared<SizeMutationHandler>();
            break;
          case 3:link = std::make_shared<VelocityMutationHandler>();
            break;
        }
        link->setPopulation(tempPopulation);
        break;
      case 2:link = std::make_shared<MoveHandler>();
        pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        link->setXYPos(x + dX, y + dY);
        link->setPopulation(tempPopulation);
        (*map)[y][x]->setCurrentPopulation(nullptr);
        (*map)[y + dY][x + dX]->setCurrentPopulation(tempPopulation);
        if (tempPopulation->GetType() == Population::HERBIVORE) {
          (*map)[y][x]->setHerbivoreCount(0);
          (*map)[y + dY][x + dX]->setHerbivoreCount(1);
        } else {
          (*map)[y][x]->setCarnivoreCount(0);
          (*map)[y + dY][x + dX]->setCarnivoreCount(1);
        }
        break;
      case 3:pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        if (dX == 0 && dY == 0) {
          link = std::make_shared<VelocityMutationHandler>();
          link->setPopulation(tempPopulation);
        } else {
          std::shared_ptr<Population> newPopulation = std::make_shared<Population>(*(tempPopulation));
          newPopulation->SetAnimalAmount(newPopulation->GetAnimalAmount() / 2);
          tempPopulation->SetAnimalAmount(tempPopulation->GetAnimalAmount() / 2);
          link = std::make_shared<MoveHandler>();
          link->setXYPos(x + dX, y + dY);
          link->setPopulation(newPopulation);
          bot->addNewPopulation(newPopulation);
          (*map)[y + dY][x + dX]->setCurrentPopulation(newPopulation);
          if (tempPopulation->GetType() == Population::HERBIVORE) {
            (*map)[y + dY][x + dX]->setHerbivoreCount(1);
          } else {
            (*map)[y + dY][x + dX]->setCarnivoreCount(1);
          }
        }
        break;
    }
    chain.push_back(link);
    if (i > 0) {
      chain[i - 1]->setNext(chain[i]);
    }
  }
  return chain[0];
}